

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Permutahedral_representation_iterators.h
# Opt level: O0

void __thiscall
Gudhi::coxeter_triangulation::
Vertex_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
::update_value(Vertex_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
               *this)

{
  bool bVar1;
  size_type sVar2;
  reference this_00;
  reference puVar3;
  reference pvVar4;
  size_type local_40;
  size_t j;
  unsigned_long i;
  const_iterator __end0;
  const_iterator __begin0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range3;
  size_t d;
  Vertex_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  *this_local;
  
  sVar2 = std::vector<int,_std::allocator<int>_>::size(&this->value_);
  this_00 = __gnu_cxx::
            __normal_iterator<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
            ::operator*(&this->o_it_);
  __end0 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(this_00);
  i = (unsigned_long)std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end(this_00);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end0,(__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                     *)&i), bVar1) {
    puVar3 = __gnu_cxx::
             __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
             ::operator*(&__end0);
    if (*puVar3 == sVar2) {
      for (local_40 = 0; local_40 < sVar2; local_40 = local_40 + 1) {
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&this->value_,local_40);
        *pvVar4 = *pvVar4 + -1;
      }
    }
    else {
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&this->value_,*puVar3);
      *pvVar4 = *pvVar4 + 1;
    }
    __gnu_cxx::
    __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
    ::operator++(&__end0);
  }
  return;
}

Assistant:

void update_value() {
    std::size_t d = value_.size();
    for (auto i : *o_it_)
      if (i != d)
        value_[i]++;
      else
        for (std::size_t j = 0; j < d; j++) value_[j]--;
  }